

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v.c
# Opt level: O2

void m256v_copy_col(m256v *M1,int c1,m256v *Mt,int ct)

{
  long lVar1;
  
  for (lVar1 = 0; lVar1 < Mt->n_row; lVar1 = lVar1 + 1) {
    Mt->e[(long)ct + Mt->rstride * lVar1] = M1->e[(long)c1 + M1->rstride * lVar1];
  }
  return;
}

Assistant:

void m256v_copy_col(const m256v* M1,
			int c1,
			m256v* Mt,
			int ct)
{
	assert (M1->n_row == Mt->n_row);

	for (int i = 0; i < Mt->n_row; ++i) {
		set_el(Mt, i, ct, get_el(M1, i, c1));
	}
}